

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::syntax::TokenOrSyntax>::reallocateTo
          (SmallVectorBase<slang::syntax::TokenOrSyntax> *this,size_type newCapacity)

{
  TokenOrSyntax *__last;
  EVP_PKEY_CTX *ctx;
  TokenOrSyntax *in_RSI;
  SmallVectorBase<slang::syntax::TokenOrSyntax> *in_RDI;
  pointer newData;
  
  __last = (TokenOrSyntax *)operator_new(0x27fdd3);
  begin(in_RDI);
  ctx = (EVP_PKEY_CTX *)end(in_RDI);
  std::uninitialized_move<slang::syntax::TokenOrSyntax*,slang::syntax::TokenOrSyntax*>
            (in_RSI,__last,(TokenOrSyntax *)in_RDI);
  cleanup(in_RDI,ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }